

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::CreateProjectFile(cmExtraEclipseCDT4Generator *this)

{
  cmLocalGenerator *this_00;
  byte bVar1;
  bool bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar3;
  cmMakefile *this_02;
  char *pcVar4;
  ulong uVar5;
  reference value;
  cmState *this_03;
  reference value_00;
  string local_c00;
  allocator local_bd9;
  string local_bd8;
  undefined1 local_bb8 [8];
  string linkSourceDirectory;
  undefined1 local_b90 [8];
  string sourceLinkedResourceName;
  string local_b68;
  allocator local_b41;
  string local_b40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b18;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b10;
  const_iterator nit_1;
  string local_b00;
  undefined1 local_ae0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraNatures;
  string local_ac0;
  char *local_aa0;
  char *extraNaturesProp;
  string local_a90;
  _Self local_a70;
  _Self local_a68;
  const_iterator nit;
  string local_a58;
  allocator local_a31;
  string local_a30;
  allocator local_a09;
  string local_a08;
  allocator local_9e1;
  string local_9e0;
  allocator local_9b9;
  string local_9b8;
  allocator local_991;
  string local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  undefined1 local_950 [8];
  ostringstream errorOutputParser;
  string local_7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  undefined1 local_798 [8];
  ostringstream environment;
  string local_620;
  allocator local_5f9;
  string local_5f8;
  char *local_5d8;
  allocator local_5ca;
  allocator local_5c9;
  string local_5c8;
  string local_5a8;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  allocator local_4c1;
  string local_4c0;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  string local_450;
  allocator local_42a;
  allocator local_429;
  string local_428;
  string local_408;
  string local_3e8;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  undefined1 local_358 [8];
  cmXMLWriter xml;
  string local_300;
  allocator local_2da;
  allocator local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  string compilerId;
  undefined1 local_288 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  this_00 = *ppcVar3;
  this_02 = cmLocalGenerator::GetMakefile(this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout.field_0x240,&this->HomeOutputDirectory,"/.project");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_288,pcVar4,false,None)
  ;
  bVar1 = std::ios::operator!((ios *)(local_288 + (long)*(_func_int **)((long)local_288 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2d8,"CMAKE_C_COMPILER_ID",&local_2d9);
    pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_2d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_2b8,pcVar4,&local_2da);
    std::allocator<char>::~allocator((allocator<char> *)&local_2da);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_300,"CMAKE_CXX_COMPILER_ID",(allocator *)&xml.field_0x4f);
      pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_300);
      std::__cxx11::string::operator=((string *)local_2b8,pcVar4);
      std::__cxx11::string::~string((string *)&local_300);
      std::allocator<char>::~allocator((allocator<char> *)&xml.field_0x4f);
    }
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_358,(ostream *)local_288,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_358,"UTF-8");
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_378,"projectDescription",&local_379);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)&local_379);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"name",&local_3a1);
    cmLocalGenerator::GetProjectName_abi_cxx11_(&local_3e8,this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_428,"CMAKE_BUILD_TYPE",&local_429);
    pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_428);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_408,pcVar4,&local_42a);
    GetPathBasename(&local_450,&this->HomeOutputDirectory);
    GenerateProjectName(&local_3c8,&local_3e8,&local_408,&local_450);
    cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_3a0,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::__cxx11::string::~string((string *)&local_450);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator((allocator<char> *)&local_42a);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator((allocator<char> *)&local_429);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_470,"comment",&local_471);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_358,&local_470,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_498,"projects",&local_499);
    cmXMLWriter::Element<char[1]>((cmXMLWriter *)local_358,&local_498,(char (*) [1])0xa67d2c);
    std::__cxx11::string::~string((string *)&local_498);
    std::allocator<char>::~allocator((allocator<char> *)&local_499);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4c0,"buildSpec",&local_4c1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_4e8,"buildCommand",&local_4e9);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_4e8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_510,"name",&local_511);
    cmXMLWriter::Element<char[38]>
              ((cmXMLWriter *)local_358,&local_510,
               (char (*) [38])"org.eclipse.cdt.make.core.makeBuilder");
    std::__cxx11::string::~string((string *)&local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_538,"triggers",&local_539);
    cmXMLWriter::Element<char[24]>
              ((cmXMLWriter *)local_358,&local_538,(char (*) [24])"clean,full,incremental,");
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_560,"arguments",&local_561);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.cleanBuildTarget",
               (char (*) [6])0xa4dc6f);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.enableCleanBuild",
               (char (*) [5])0xa43678);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.append_environment",
               (char (*) [5])0xa43678);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.stopOnError",
               (char (*) [5])0xa43678);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.enabledIncrementalBuild",
               (char (*) [5])0xa43678);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5c8,"CMAKE_MAKE_PROGRAM",&local_5c9);
    pcVar4 = cmMakefile::GetRequiredDefinition(this_02,&local_5c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5a8,pcVar4,&local_5ca);
    GetEclipsePath(&local_588,&local_5a8);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.command",&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::__cxx11::string::~string((string *)&local_5a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5ca);
    std::__cxx11::string::~string((string *)&local_5c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
    AppendDictionary<char[47]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.contents",
               (char (*) [47])"org.eclipse.cdt.make.core.activeConfigSettings");
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.target.inc",
               (char (*) [4])0xa4236d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5f8,"CMAKE_ECLIPSE_MAKE_ARGUMENTS",&local_5f9);
    local_5d8 = cmMakefile::GetSafeDefinition(this_02,&local_5f8);
    AppendDictionary<char_const*>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.arguments",&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
    GetEclipsePath(&local_620,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.buildLocation",&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.useDefaultBuildCmd",
               (char (*) [6])0xa59149);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_798);
    std::operator<<((ostream *)local_798,"VERBOSE=1|CMAKE_NO_VERBOSE=1|");
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      AddEnvVar((ostream *)local_798,"PATH",this_00);
      AddEnvVar((ostream *)local_798,"INCLUDE",this_00);
      AddEnvVar((ostream *)local_798,"LIB",this_00);
      AddEnvVar((ostream *)local_798,"LIBPATH",this_00);
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        AddEnvVar((ostream *)local_798,"INTEL_LICENSE_FILE",this_00);
      }
    }
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.environment",&local_7b8);
    std::__cxx11::string::~string((string *)&local_7b8);
    AppendDictionary<char[5]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.enableFullBuild",
               (char (*) [5])0xa43678);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.target.auto",
               (char (*) [4])0xa4236d);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.enableAutoBuild",
               (char (*) [6])0xa59149);
    AppendDictionary<char[6]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.target.clean",
               (char (*) [6])0xa4dc6f);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.fullBuildTarget",
               (char (*) [4])0xa4236d);
    AppendDictionary<char[1]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.buildArguments",
               (char (*) [1])0xa67d2c);
    GetEclipsePath(&local_7d8,&this->HomeOutputDirectory);
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.build.location",&local_7d8);
    std::__cxx11::string::~string((string *)&local_7d8);
    AppendDictionary<char[4]>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.make.core.autoBuildTarget",
               (char (*) [4])0xa4236d);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_950);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2b8,"MSVC");
    if (bVar2) {
      std::operator<<((ostream *)local_950,"org.eclipse.cdt.core.VCErrorParser;");
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2b8,"Intel");
      if (bVar2) {
        std::operator<<((ostream *)local_950,"org.eclipse.cdt.core.ICCErrorParser;");
      }
    }
    if ((this->SupportsGmakeErrorParser & 1U) == 0) {
      std::operator<<((ostream *)local_950,"org.eclipse.cdt.core.MakeErrorParser;");
    }
    else {
      std::operator<<((ostream *)local_950,"org.eclipse.cdt.core.GmakeErrorParser;");
    }
    std::operator<<((ostream *)local_950,
                    "org.eclipse.cdt.core.GCCErrorParser;org.eclipse.cdt.core.GASErrorParser;org.eclipse.cdt.core.GLDErrorParser;"
                   );
    std::__cxx11::ostringstream::str();
    AppendDictionary<std::__cxx11::string>
              ((cmXMLWriter *)local_358,"org.eclipse.cdt.core.errorOutputParser",&local_970);
    std::__cxx11::string::~string((string *)&local_970);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_990,"buildCommand",&local_991);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_990);
    std::__cxx11::string::~string((string *)&local_990);
    std::allocator<char>::~allocator((allocator<char> *)&local_991);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9b8,"name",&local_9b9);
    cmXMLWriter::Element<char[47]>
              ((cmXMLWriter *)local_358,&local_9b8,
               (char (*) [47])"org.eclipse.cdt.make.core.ScannerConfigBuilder");
    std::__cxx11::string::~string((string *)&local_9b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9e0,"arguments",&local_9e1);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a08,"natures",&local_a09);
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_a08);
    std::__cxx11::string::~string((string *)&local_a08);
    std::allocator<char>::~allocator((allocator<char> *)&local_a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"nature",&local_a31);
    cmXMLWriter::Element<char[37]>
              ((cmXMLWriter *)local_358,&local_a30,
               (char (*) [37])"org.eclipse.cdt.make.core.makeNature");
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_a58,"nature",(allocator *)((long)&nit._M_node + 7));
    cmXMLWriter::Element<char[46]>
              ((cmXMLWriter *)local_358,&local_a58,
               (char (*) [46])"org.eclipse.cdt.make.core.ScannerConfigNature");
    std::__cxx11::string::~string((string *)&local_a58);
    std::allocator<char>::~allocator((allocator<char> *)((long)&nit._M_node + 7));
    local_a68._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->Natures);
    while( true ) {
      local_a70._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->Natures);
      bVar2 = std::operator!=(&local_a68,&local_a70);
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a90,"nature",(allocator *)((long)&extraNaturesProp + 7));
      value = std::
              _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&local_a68);
      cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_a90,value);
      std::__cxx11::string::~string((string *)&local_a90);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraNaturesProp + 7));
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_a68);
    }
    this_03 = cmMakefile::GetState(this_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_ac0,"ECLIPSE_EXTRA_NATURES",
               (allocator *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmState::GetGlobalProperty(this_03,&local_ac0);
    std::__cxx11::string::~string((string *)&local_ac0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&extraNatures.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_aa0 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_ae0);
      pcVar4 = local_aa0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b00,pcVar4,(allocator *)((long)&nit_1._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_b00,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_ae0,false);
      std::__cxx11::string::~string((string *)&local_b00);
      std::allocator<char>::~allocator((allocator<char> *)((long)&nit_1._M_current + 7));
      local_b18._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_ae0);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_b10,&local_b18);
      while( true ) {
        local_b20._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_ae0);
        bVar2 = __gnu_cxx::operator!=(&local_b10,&local_b20);
        if (!bVar2) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b40,"nature",&local_b41);
        value_00 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_b10);
        cmXMLWriter::Element<std::__cxx11::string>((cmXMLWriter *)local_358,&local_b40,value_00);
        std::__cxx11::string::~string((string *)&local_b40);
        std::allocator<char>::~allocator((allocator<char> *)&local_b41);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_b10);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_ae0);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b68,"linkedResources",
               (allocator *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    cmXMLWriter::StartElement((cmXMLWriter *)local_358,&local_b68);
    std::__cxx11::string::~string((string *)&local_b68);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sourceLinkedResourceName.field_2._M_local_buf + 0xf));
    if ((this->IsOutOfSourceBuild & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_b90,"[Source directory]",
                 (allocator *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator
                ((allocator<char> *)(linkSourceDirectory.field_2._M_local_buf + 0xf));
      pcVar4 = cmLocalGenerator::GetCurrentSourceDirectory(this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_bd8,pcVar4,&local_bd9);
      GetEclipsePath((string *)local_bb8,&local_bd8);
      std::__cxx11::string::~string((string *)&local_bd8);
      std::allocator<char>::~allocator((allocator<char> *)&local_bd9);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,(string *)local_bb8);
      if (!bVar2) {
        GetEclipsePath(&local_c00,(string *)local_bb8);
        AppendLinkedResource((cmXMLWriter *)local_358,(string *)local_b90,&local_c00,LinkToFolder);
        std::__cxx11::string::~string((string *)&local_c00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->SrcLinkedResources,(value_type *)local_b90);
      }
      std::__cxx11::string::~string((string *)local_bb8);
      std::__cxx11::string::~string((string *)local_b90);
    }
    if ((this->SupportsVirtualFolders & 1U) != 0) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_358,&this->HomeOutputDirectory);
      CreateLinksForTargets(this,(cmXMLWriter *)local_358);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    cmXMLWriter::EndElement((cmXMLWriter *)local_358);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_950);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_798);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_358);
    std::__cxx11::string::~string((string *)local_2b8);
    compilerId.field_2._8_4_ = 0;
  }
  else {
    compilerId.field_2._8_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_288);
  std::__cxx11::string::~string((string *)&fout.field_0x240);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateProjectFile()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  cmMakefile* mf = lg->GetMakefile();

  const std::string filename = this->HomeOutputDirectory + "/.project";

  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }

  std::string compilerId = mf->GetSafeDefinition("CMAKE_C_COMPILER_ID");
  if (compilerId.empty()) // no C compiler, try the C++ compiler:
  {
    compilerId = mf->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
  }

  cmXMLWriter xml(fout);

  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");

  xml.Element("name", this->GenerateProjectName(
                        lg->GetProjectName(),
                        mf->GetSafeDefinition("CMAKE_BUILD_TYPE"),
                        this->GetPathBasename(this->HomeOutputDirectory)));

  xml.Element("comment", "");
  xml.Element("projects", "");

  xml.StartElement("buildSpec");
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.makeBuilder");
  xml.Element("triggers", "clean,full,incremental,");
  xml.StartElement("arguments");

  // use clean target
  AppendDictionary(xml, "org.eclipse.cdt.make.core.cleanBuildTarget", "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableCleanBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.append_environment",
                   "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.stopOnError", "true");

  // set the make command
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enabledIncrementalBuild",
                   "true");
  AppendDictionary(
    xml, "org.eclipse.cdt.make.core.build.command",
    this->GetEclipsePath(mf->GetRequiredDefinition("CMAKE_MAKE_PROGRAM")));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.contents",
                   "org.eclipse.cdt.make.core.activeConfigSettings");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.inc", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.arguments",
                   mf->GetSafeDefinition("CMAKE_ECLIPSE_MAKE_ARGUMENTS"));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildLocation",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.useDefaultBuildCmd",
                   "false");

  // set project specific environment
  std::ostringstream environment;
  environment << "VERBOSE=1|CMAKE_NO_VERBOSE=1|"; // verbose Makefile output
  // set vsvars32.bat environment available at CMake time,
  //   but not necessarily when eclipse is open
  if (compilerId == "MSVC") {
    AddEnvVar(environment, "PATH", lg);
    AddEnvVar(environment, "INCLUDE", lg);
    AddEnvVar(environment, "LIB", lg);
    AddEnvVar(environment, "LIBPATH", lg);
  } else if (compilerId == "Intel") {
    // if the env.var is set, use this one and put it in the cache
    // if the env.var is not set, but the value is in the cache,
    // use it from the cache:
    AddEnvVar(environment, "INTEL_LICENSE_FILE", lg);
  }
  AppendDictionary(xml, "org.eclipse.cdt.make.core.environment",
                   environment.str());

  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableFullBuild", "true");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.auto", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.enableAutoBuild", "false");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.target.clean",
                   "clean");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.fullBuildTarget", "all");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.buildArguments", "");
  AppendDictionary(xml, "org.eclipse.cdt.make.core.build.location",
                   this->GetEclipsePath(this->HomeOutputDirectory));
  AppendDictionary(xml, "org.eclipse.cdt.make.core.autoBuildTarget", "all");

  // set error parsers
  std::ostringstream errorOutputParser;

  if (compilerId == "MSVC") {
    errorOutputParser << "org.eclipse.cdt.core.VCErrorParser;";
  } else if (compilerId == "Intel") {
    errorOutputParser << "org.eclipse.cdt.core.ICCErrorParser;";
  }

  if (this->SupportsGmakeErrorParser) {
    errorOutputParser << "org.eclipse.cdt.core.GmakeErrorParser;";
  } else {
    errorOutputParser << "org.eclipse.cdt.core.MakeErrorParser;";
  }

  errorOutputParser << "org.eclipse.cdt.core.GCCErrorParser;"
                       "org.eclipse.cdt.core.GASErrorParser;"
                       "org.eclipse.cdt.core.GLDErrorParser;";
  AppendDictionary(xml, "org.eclipse.cdt.core.errorOutputParser",
                   errorOutputParser.str());

  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.StartElement("buildCommand");
  xml.Element("name", "org.eclipse.cdt.make.core.ScannerConfigBuilder");
  xml.StartElement("arguments");
  xml.EndElement(); // arguments
  xml.EndElement(); // buildCommand
  xml.EndElement(); // buildSpec

  // set natures for c/c++ projects
  xml.StartElement("natures");
  xml.Element("nature", "org.eclipse.cdt.make.core.makeNature");
  xml.Element("nature", "org.eclipse.cdt.make.core.ScannerConfigNature");
  ;

  for (std::set<std::string>::const_iterator nit = this->Natures.begin();
       nit != this->Natures.end(); ++nit) {
    xml.Element("nature", *nit);
  }

  if (const char* extraNaturesProp =
        mf->GetState()->GetGlobalProperty("ECLIPSE_EXTRA_NATURES")) {
    std::vector<std::string> extraNatures;
    cmSystemTools::ExpandListArgument(extraNaturesProp, extraNatures);
    for (std::vector<std::string>::const_iterator nit = extraNatures.begin();
         nit != extraNatures.end(); ++nit) {
      xml.Element("nature", *nit);
    }
  }

  xml.EndElement(); // natures

  xml.StartElement("linkedResources");
  // create linked resources
  if (this->IsOutOfSourceBuild) {
    // create a linked resource to CMAKE_SOURCE_DIR
    // (this is not done anymore for each project because of
    // https://gitlab.kitware.com/cmake/cmake/issues/9978 and because I found
    // it actually quite confusing in bigger projects with many directories and
    // projects, Alex

    std::string sourceLinkedResourceName = "[Source directory]";
    std::string linkSourceDirectory =
      this->GetEclipsePath(lg->GetCurrentSourceDirectory());
    // .project dir can't be subdir of a linked resource dir
    if (!cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                       linkSourceDirectory)) {
      this->AppendLinkedResource(xml, sourceLinkedResourceName,
                                 this->GetEclipsePath(linkSourceDirectory),
                                 LinkToFolder);
      this->SrcLinkedResources.push_back(sourceLinkedResourceName);
    }
  }

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeOutputDirectory);

    this->CreateLinksForTargets(xml);
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
}